

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

string * AlternativeLoader::getContinentID
                   (string *__return_storage_ptr__,string *continentName,
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *continentData)

{
  pointer pvVar1;
  pointer __s2;
  size_t __n;
  pointer pbVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  string *__str;
  uint __val;
  ulong uVar7;
  pointer pvVar8;
  
  pvVar8 = (continentData->
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (continentData->
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar8 != pvVar1) {
    __s2 = (continentName->_M_dataplus)._M_p;
    __n = continentName->_M_string_length;
    __val = 1;
    do {
      pbVar2 = (pvVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pbVar2->_M_string_length == __n) &&
         ((__n == 0 || (iVar5 = bcmp((pbVar2->_M_dataplus)._M_p,__s2,__n), iVar5 == 0)))) {
        cVar4 = '\x01';
        if (__val < 10) goto LAB_0011ae83;
        uVar7 = (ulong)__val;
        cVar3 = '\x04';
        goto LAB_0011ae4b;
      }
      pvVar8 = pvVar8 + 1;
      __val = __val + 1;
    } while (pvVar8 != pvVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  *(__return_storage_ptr__->_M_dataplus)._M_p = '0';
  return __return_storage_ptr__;
LAB_0011ae4b:
  cVar4 = cVar3;
  uVar6 = (uint)uVar7;
  if (uVar6 < 100) {
    cVar4 = cVar4 + -2;
    goto LAB_0011ae83;
  }
  if (uVar6 < 1000) {
    cVar4 = cVar4 + -1;
    goto LAB_0011ae83;
  }
  if (uVar6 < 10000) goto LAB_0011ae83;
  uVar7 = uVar7 / 10000;
  cVar3 = cVar4 + '\x04';
  if (uVar6 < 100000) {
    cVar4 = cVar4 + '\x01';
LAB_0011ae83:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p,
               (uint)__return_storage_ptr__->_M_string_length,__val);
    return __return_storage_ptr__;
  }
  goto LAB_0011ae4b;
}

Assistant:

std::string AlternativeLoader::getContinentID(const std::string& continentName,std::vector<std::vector<std::string>> continentData) {
    unsigned int counter = 0;
    for(auto& i : continentData){
        if(i[0] == continentName){
            return std::to_string(counter + 1);
        }
        counter++;
    }
    return std::to_string(0);
}